

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O0

RecyclerTestObject * TrackedObject<1U,_50U>::New(void)

{
  Recycler *pRVar1;
  TrackedObject<1U,_50U> *this;
  TrackedObject<1U,_50U> *local_78;
  FinalizableObject *local_50;
  TrackAllocData local_38;
  uint local_c;
  uint count;
  
  local_c = GetRandomInteger(0x32);
  pRVar1 = recyclerInstance;
  local_c = local_c + 1;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&TrackedObject<1u,50u>::typeinfo,(ulong)local_c << 3,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/GCStress/RecyclerTestObject.h"
             ,0x110);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_38);
  this = (TrackedObject<1U,_50U> *)new<Memory::Recycler>(0x20,pRVar1,0x220400,0);
  TrackedObject(this,local_c);
  local_50 = (FinalizableObject *)0x0;
  if (this != (TrackedObject<1U,_50U> *)0x0) {
    local_50 = &this->super_FinalizableObject;
  }
  if (local_50 == (FinalizableObject *)0x0) {
    local_78 = (TrackedObject<1U,_50U> *)0x0;
  }
  else {
    local_78 = (TrackedObject<1U,_50U> *)(local_50 + -2);
  }
  return &local_78->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewTrackedLeafPlusZ(recyclerInstance, sizeof(RecyclerTestObject *) * count, TrackedObject, count);
    }